

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_refs.cpp
# Opt level: O3

void store_ref_to_cpb(EncVirtualCpb *cpb,EncFrmStatus *frm)

{
  ulong uVar1;
  EncFrmStatus EVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  long lVar7;
  uint uVar8;
  bool bVar9;
  
  uVar1 = frm->val;
  uVar5 = uVar1;
  if ((uVar1 & 1) == 0) {
    _mpp_log_l(2,"mpp_enc_refs","Assertion %s failed at %s:%d\n",(char *)0x0,"frm->valid",
               "store_ref_to_cpb",0x1ff);
    if ((mpp_debug._3_1_ & 0x10) != 0) {
      abort();
    }
    uVar5 = frm->val;
  }
  if ((uVar5 & 0x40) == 0) {
    if ((uVar5 & 0x10) != 0) {
      cpb->mode_refs[3].val = uVar5;
      uVar5 = frm->val;
    }
    uVar3 = (uint)(uVar1 >> 0xc) & 0xf;
    if ((char)uVar5 < '\0') {
      uVar8 = (uint)uVar1 >> 8 & 0xf;
      cpb->lt_idx_refs[uVar8].val = uVar5;
      EVar2 = *frm;
      cpb->st_tid_refs[uVar3] = EVar2;
      cpb->mode_refs[0] = EVar2;
      EVar2 = *frm;
      cpb->mode_refs[2] = EVar2;
      bVar9 = false;
      uVar5 = 0;
      do {
        uVar4 = uVar5;
        if ((cpb->cpb_refs[uVar4 + 0x10].val & 1) == 0) {
          pcVar6 = "add";
          uVar5 = uVar4 & 0xffffffff;
          goto LAB_0014cf81;
        }
        if (((uint)(cpb->cpb_refs[uVar4 + 0x10].val >> 8) & 0xf) == uVar8) {
          uVar5 = uVar4 & 0xffffffff;
          goto LAB_0014cf4f;
        }
        bVar9 = 0xe < uVar4;
        uVar5 = uVar4 + 1;
      } while (uVar4 + 1 != 0x10);
      uVar5 = 0x10;
LAB_0014cf4f:
      if (bVar9) {
        _mpp_log_l(2,"mpp_enc_refs","frm %d with lt idx %d found no place to add or relace\n",
                   "store_ref_to_cpb",uVar1 >> 0x30,(ulong)uVar8);
      }
      else {
        pcVar6 = "replace";
LAB_0014cf81:
        cpb->cpb_refs[uVar4 + 0x10] = EVar2;
        if (((byte)enc_refs_debug & 2) != 0) {
          _mpp_log_l(4,"mpp_enc_refs","frm %d with lt idx %d %s to pos %d\n","store_ref_to_cpb",
                     uVar1 >> 0x30,(ulong)uVar8,pcVar6,uVar5);
        }
      }
    }
    else {
      cpb->st_tid_refs[uVar3].val = uVar5;
      EVar2 = *frm;
      cpb->mode_refs[0] = EVar2;
      cpb->mode_refs[1] = EVar2;
      memmove(cpb->cpb_refs + 1,cpb->cpb_refs,0x78);
      cpb->cpb_refs[0] = *frm;
    }
    if (((byte)enc_refs_debug & 2) != 0) {
      _mpp_log_l(4,"mpp_enc_refs","dumping cpb refs status start\n","store_ref_to_cpb");
      if (((byte)enc_refs_debug & 2) != 0) {
        lVar7 = 0;
        do {
          if ((*(byte *)((long)cpb->cpb_refs + lVar7) & 1) != 0) {
            _dump_frm((EncFrmStatus *)((long)cpb->cpb_refs + lVar7),"store_ref_to_cpb",0x23d);
          }
          lVar7 = lVar7 + 8;
        } while (lVar7 != 0x100);
        if (((byte)enc_refs_debug & 2) != 0) {
          _mpp_log_l(4,"mpp_enc_refs","dumping cpb refs status done\n","store_ref_to_cpb");
          return;
        }
      }
    }
  }
  return;
}

Assistant:

static void store_ref_to_cpb(EncVirtualCpb *cpb, EncFrmStatus *frm)
{
    RK_S32 seq_idx = frm->seq_idx;
    RK_S32 lt_idx = frm->lt_idx;
    RK_S32 tid = frm->temporal_id;
    RK_S32 i;

    mpp_assert(frm->valid);
    mpp_assert(lt_idx < MAX_CPB_LT_IDX);
    mpp_assert(tid < MAX_CPB_LT_FRM);

    /* non-ref do not save to cpb */
    if (frm->is_non_ref)
        return ;

    if (frm->is_intra)
        cpb->mode_refs[REF_TO_PREV_INTRA].val = frm->val;

    if (frm->is_lt_ref) {
        cpb->lt_idx_refs[lt_idx].val = frm->val;
        cpb->st_tid_refs[tid].val = frm->val;
        cpb->mode_refs[REF_TO_PREV_REF_FRM].val = frm->val;
        cpb->mode_refs[REF_TO_PREV_LT_REF].val = frm->val;

        RK_S32 found = 0;
        EncFrmStatus *cpb_ref = NULL;

        /* find same lt_idx and replace */
        for (i = 0; i < MAX_CPB_LT_FRM; i++) {
            RK_S32 cpb_idx = i + MAX_CPB_ST_FRM;
            cpb_ref = &cpb->cpb_refs[cpb_idx];

            if (!cpb_ref->valid) {
                found = 1;
                break;
            } else {
                if (cpb_ref->lt_idx == lt_idx) {
                    found = 2;
                    break;
                }
            }
        }

        if (found) {
            cpb_ref->val = frm->val;
            enc_refs_dbg_flow("frm %d with lt idx %d %s to pos %d\n",
                              seq_idx, lt_idx, (found == 1) ? "add" : "replace", i);
        } else {
            mpp_err_f("frm %d with lt idx %d found no place to add or relace\n",
                      seq_idx, lt_idx);
        }
    } else {
        /* do normal st sliding window */
        cpb->st_tid_refs[tid].val = frm->val;
        cpb->mode_refs[REF_TO_PREV_REF_FRM].val = frm->val;
        cpb->mode_refs[REF_TO_PREV_ST_REF].val = frm->val;

        for (i = MAX_CPB_ST_FRM - 1; i > 0; i--)
            cpb->cpb_refs[i].val = cpb->cpb_refs[i - 1].val;

        cpb->cpb_refs[0].val = frm->val;

        // TODO: Add prev intra valid check?
    }

    enc_refs_dbg_flow("dumping cpb refs status start\n");
    if (enc_refs_debug & MPP_ENC_REFS_DBG_FLOW)
        for (i = 0; i < MAX_CPB_FRM; i++)
            if (cpb->cpb_refs[i].valid)
                dump_frm(&cpb->cpb_refs[i]);

    enc_refs_dbg_flow("dumping cpb refs status done\n");
}